

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::ClearTrackAllocInfo(Recycler *this,TrackAllocData *data)

{
  code *pcVar1;
  type_info *ptVar2;
  size_t sVar3;
  char *pcVar4;
  undefined4 uVar5;
  bool bVar6;
  undefined4 *puVar7;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    if ((((this->nextAllocData).typeinfo == (type_info *)0x0) &&
        ((this->nextAllocData).plusSize == 0)) && ((this->nextAllocData).count == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1fbe,"(!nextAllocData.IsEmpty())",
                         "Missing tracking information for this allocation, are you not using the macros?"
                        );
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    if (data != (TrackAllocData *)0x0) {
      uVar5 = *(undefined4 *)&(this->nextAllocData).field_0x24;
      data->line = (this->nextAllocData).line;
      *(undefined4 *)&data->field_0x24 = uVar5;
      ptVar2 = (this->nextAllocData).typeinfo;
      sVar3 = (this->nextAllocData).plusSize;
      pcVar4 = (this->nextAllocData).filename;
      data->count = (this->nextAllocData).count;
      data->filename = pcVar4;
      data->typeinfo = ptVar2;
      data->plusSize = sVar3;
    }
    (this->nextAllocData).typeinfo = (type_info *)0x0;
    (this->nextAllocData).plusSize = 0;
    (this->nextAllocData).count = 0;
  }
  return;
}

Assistant:

void
Recycler::ClearTrackAllocInfo(TrackAllocData* data/* = NULL*/)
{
#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        AssertMsg(!nextAllocData.IsEmpty(), "Missing tracking information for this allocation, are you not using the macros?");
        if (data)
        {
            *data = nextAllocData;
        }
        nextAllocData.Clear();
    }
#endif
}